

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O1

bool c4::is_debugger_attached(void)

{
  undefined1 uVar1;
  int __fd;
  int iVar2;
  ssize_t sVar3;
  char *pcVar4;
  char buf [1024];
  char acStack_408 [1024];
  
  uVar1 = is_debugger_attached::first_call_result;
  if (is_debugger_attached()::first_call == '\0') {
    is_debugger_attached()::first_call = '\x01';
    memset(acStack_408,0,0x400);
    __fd = open("/proc/self/status",0);
    if (__fd != -1) {
      sVar3 = read(__fd,acStack_408,0x400);
      if (0 < sVar3) {
        if (sVar3 < 0x400) {
          acStack_408[sVar3] = '\0';
        }
        pcVar4 = strstr(acStack_408,"TracerPid:");
        if (pcVar4 != (char *)0x0) {
          iVar2 = atoi(pcVar4 + 10);
          is_debugger_attached::first_call_result = iVar2 != 0;
        }
      }
      if (__fd != -1) {
        return is_debugger_attached::first_call_result;
      }
    }
    uVar1 = 0;
  }
  return (bool)uVar1;
}

Assistant:

bool is_debugger_attached()
{
#if defined(C4_UNIX) || defined(C4_LINUX)
    static bool first_call = true;
    static bool first_call_result = false;
    if(first_call)
    {
        first_call = false;
        //! @see http://stackoverflow.com/questions/3596781/how-to-detect-if-the-current-process-is-being-run-by-gdb
        //! (this answer: http://stackoverflow.com/a/24969863/3968589 )
        char buf[1024] = "";

        int status_fd = open("/proc/self/status", O_RDONLY);
        if (status_fd == -1)
        {
            return 0;
        }

        ssize_t num_read = ::read(status_fd, buf, sizeof(buf));

        if (num_read > 0)
        {
            static const char TracerPid[] = "TracerPid:";
            char *tracer_pid;

            if(num_read < 1024)
            {
                buf[num_read] = 0;
            }
            tracer_pid = strstr(buf, TracerPid);
            if (tracer_pid)
            {
                first_call_result = !!::atoi(tracer_pid + sizeof(TracerPid) - 1);
            }
        }
    }
    return first_call_result;
#elif defined(C4_PS4)
    return (sceDbgIsDebuggerAttached() != 0);
#elif defined(C4_XBOX) || (defined(C4_WIN) && defined(C4_MSVC))
    return IsDebuggerPresent() != 0;
#elif defined(C4_MACOS) || defined(C4_IOS)
    // https://stackoverflow.com/questions/2200277/detecting-debugger-on-mac-os-x
    // Returns true if the current process is being debugged (either
    // running under the debugger or has a debugger attached post facto).
    int                 junk;
    int                 mib[4];
    struct kinfo_proc   info;
    size_t              size;

    // Initialize the flags so that, if sysctl fails for some bizarre
    // reason, we get a predictable result.

    info.kp_proc.p_flag = 0;

    // Initialize mib, which tells sysctl the info we want, in this case
    // we're looking for information about a specific process ID.

    mib[0] = CTL_KERN;
    mib[1] = KERN_PROC;
    mib[2] = KERN_PROC_PID;
    mib[3] = getpid();

    // Call sysctl.

    size = sizeof(info);
    junk = sysctl(mib, sizeof(mib) / sizeof(*mib), &info, &size, NULL, 0);
    assert(junk == 0);

    // We're being debugged if the P_TRACED flag is set.
    return ((info.kp_proc.p_flag & P_TRACED) != 0);
#else
    return false;
#endif
}